

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3e3aa::time_zone_setter::time_zone_setter(time_zone_setter *this,czstring tz)

{
  undefined8 *puVar1;
  not_null<const_char_*> __value;
  char *__s;
  size_t sVar2;
  int __replace;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  not_null<const_char_*> local_40;
  not_null<const_char_*> local_38;
  
  __s = getenv("TZ");
  if (__s == (char *)0x0) {
    *(undefined8 *)((long)&(this->old_).storage_ + 8) = 0;
    *(undefined8 *)((long)&(this->old_).storage_ + 0x10) = 0;
    *(undefined8 *)&this->old_ = 0;
    (this->old_).storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&(this->old_).storage_ + 0x18) = 0;
  }
  else {
    local_60 = &local_50;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s,__s + sVar2);
    (this->old_).valid_ = true;
    puVar1 = (undefined8 *)((long)&(this->old_).storage_ + 0x10);
    *(undefined8 **)&(this->old_).storage_ = puVar1;
    if (local_60 == &local_50) {
      *puVar1 = CONCAT71(uStack_4f,local_50);
      *(undefined8 *)((long)&(this->old_).storage_ + 0x18) = uStack_48;
    }
    else {
      *(undefined1 **)&(this->old_).storage_ = local_60;
      *(ulong *)((long)&(this->old_).storage_ + 0x10) = CONCAT71(uStack_4f,local_50);
    }
    *(undefined8 *)((long)&(this->old_).storage_ + 8) = local_58;
    local_58 = 0;
    local_50 = 0;
    local_60 = &local_50;
  }
  if ((__s != (char *)0x0) && (local_60 != &local_50)) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  local_40.ptr_ = tz;
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_40);
  __value.ptr_ = local_40.ptr_;
  local_38.ptr_ = "TZ";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_38);
  setenv(local_38.ptr_,__value.ptr_,__replace);
  return;
}

Assistant:

time_zone_setter::time_zone_setter (czstring tz)
            : old_ (time_zone_setter::tz_value ()) {
        time_zone_setter::set_tz (tz);
    }